

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *table_var)

{
  Result RVar1;
  char *pcVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  Var local_f0;
  Enum local_a4;
  Var local_a0;
  Enum local_58;
  ElemType local_54;
  undefined1 local_50 [4];
  ElemType elem_type;
  TableType table_type;
  Var *table_var_local;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  TableType::TableType((TableType *)local_50);
  Var::Var(&local_a0,table_var);
  local_58 = (Enum)CheckTableIndex(this,&local_a0,(TableType *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_58);
  Var::~Var(&local_a0);
  Var::Var(&local_f0,segment_var);
  local_a4 = (Enum)CheckElemSegmentIndex(this,&local_f0,&local_54);
  pcVar3 = (char *)(ulong)local_a4;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_a4);
  Var::~Var(&local_f0);
  pcVar2 = Var::index(table_var,pcVar3,__c);
  pcVar3 = Var::index(segment_var,pcVar3,__c_00);
  RVar1 = TypeChecker::OnTableInit(&this->typechecker_,(uint32_t)pcVar2,(uint32_t)pcVar3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckType(this,loc,local_54.element,(Type)local_50,"table.init");
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableInit(const Location& loc,
                                    Var segment_var,
                                    Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType table_type;
  ElemType elem_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= CheckElemSegmentIndex(segment_var, &elem_type);
  result |= typechecker_.OnTableInit(table_var.index(), segment_var.index());
  result |= CheckType(loc, elem_type.element, table_type.element, "table.init");
  return result;
}